

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

void __thiscall ON_SubD::SetSubDAppearance(ON_SubD *this,ON_SubDComponentLocation subd_appearance)

{
  element_type *peVar1;
  ON_SubDComponentLocation *pOVar2;
  ON_SubDimple *pOVar3;
  
  peVar1 = (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    pOVar2 = &DefaultSubDAppearance;
  }
  else {
    pOVar2 = &peVar1->m_subd_appearance;
  }
  if (((byte)(subd_appearance - ControlNet) < 2) && (*pOVar2 != subd_appearance)) {
    pOVar3 = SubDimple(this,true);
    if ((pOVar3 != (ON_SubDimple *)0x0) && (pOVar3->m_subd_appearance != subd_appearance)) {
      pOVar3->m_subd_appearance = subd_appearance;
    }
  }
  return;
}

Assistant:

void ON_SubD::SetSubDAppearance(ON_SubDComponentLocation subd_appearance) const
{
  if (
    subd_appearance != SubDAppearance()
    && (ON_SubDComponentLocation::Surface == subd_appearance || ON_SubDComponentLocation::ControlNet == subd_appearance)
    )
  {
    const ON_SubDimple* subdimple = const_cast<ON_SubD*>(this)->SubDimple(true);
    if (nullptr != subdimple)
      subdimple->SetSubDAppearance(subd_appearance);
  }
}